

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFileImpl
          (DescriptorBuilder *this,FileDescriptorProto *proto)

{
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Tables *this_01;
  OptionsToInterpret *__last;
  Message *message;
  MessageLite *this_02;
  OptionsToInterpret *__first;
  bool bVar2;
  byte bVar3;
  int iVar4;
  FileDescriptor *file;
  SourceCodeInfo *this_03;
  FileDescriptorTables *pFVar5;
  string *psVar6;
  FileDescriptor **ppFVar7;
  once_flag *poVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **__s;
  const_iterator cVar9;
  iterator iVar10;
  int *piVar11;
  FileDescriptor *pFVar12;
  undefined4 extraout_var;
  FieldDescriptor *pFVar13;
  LogMessage *pLVar14;
  undefined4 extraout_var_00;
  MessageLite *this_04;
  int iVar15;
  long lVar16;
  OptionsToInterpret *pOVar17;
  long lVar18;
  void *extraout_RDX;
  void *pvVar19;
  void *extraout_RDX_00;
  FileDescriptor *extraout_RDX_01;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX_02;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *paVar20;
  Reflection *this_05;
  Reflection *this_06;
  Reflection *this_07;
  Reflection *this_08;
  Reflection *this_09;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX_03;
  FileDescriptor *extraout_RDX_04;
  FileDescriptor *pFVar21;
  FileDescriptor *extraout_RDX_05;
  FileDescriptor *extraout_RDX_06;
  int i_2;
  undefined1 *puVar22;
  DescriptorPool *pDVar23;
  int i;
  int i_3;
  int i_1;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar24;
  string buf;
  SourceCodeInfo *local_218;
  vector<int,_std::allocator<int>_> src_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  FileDescriptor *dependency;
  OptionsToInterpret *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1c0 [11];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  set<int,_std::less<int>,_std::allocator<int>_> weak_deps;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seen_dependencies;
  undefined4 extraout_var_01;
  
  file = DescriptorPool::Tables::Allocate<google::protobuf::FileDescriptor>(this->tables_);
  this->file_ = file;
  *(undefined2 *)(file + 0x40) = 0;
  if (((proto->_has_bits_).has_bits_[0] & 0x10) == 0) {
    local_218 = (SourceCodeInfo *)0x0;
    this_03 = SourceCodeInfo::default_instance();
  }
  else {
    this_03 = DescriptorPool::Tables::AllocateMessage<google::protobuf::SourceCodeInfo>
                        (this->tables_,(SourceCodeInfo *)0x0);
    puVar22 = (undefined1 *)proto->source_code_info_;
    if ((SourceCodeInfo *)puVar22 == (SourceCodeInfo *)0x0) {
      puVar22 = _SourceCodeInfo_default_instance_;
    }
    SourceCodeInfo::CopyFrom(this_03,(SourceCodeInfo *)puVar22);
    local_218 = this_03;
  }
  *(SourceCodeInfo **)(file + 0x98) = this_03;
  pFVar5 = DescriptorPool::Tables::AllocateFileTables(this->tables_);
  this->file_tables_ = pFVar5;
  *(FileDescriptorTables **)(this->file_ + 0x90) = pFVar5;
  if (((proto->_has_bits_).has_bits_[0] & 1) == 0) {
    std::__cxx11::string::string
              ((string *)&dependency,anon_var_dwarf_353f69 + 0x11,(allocator *)&buf);
    AddError(this,(string *)&dependency,&proto->super_Message,OTHER,
             "Missing field: FileDescriptorProto.name.");
    std::__cxx11::string::~string((string *)&dependency);
  }
  __lhs = (proto->syntax_).ptr_;
  if (__lhs->_M_string_length != 0) {
    bVar2 = std::operator==(__lhs,"proto2");
    if (!bVar2) {
      bVar2 = std::operator==((proto->syntax_).ptr_,"proto3");
      if (bVar2) {
        *(undefined4 *)(this->file_ + 0x3c) = 3;
      }
      else {
        *(undefined4 *)(this->file_ + 0x3c) = 0;
        psVar6 = (proto->name_).ptr_;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &dependency,"Unrecognized syntax: ",(proto->syntax_).ptr_);
        AddError(this,psVar6,&proto->super_Message,OTHER,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dependency);
        std::__cxx11::string::~string((string *)&dependency);
      }
      goto LAB_0029525b;
    }
  }
  *(undefined4 *)(this->file_ + 0x3c) = 2;
LAB_0029525b:
  psVar6 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  *(string **)file = psVar6;
  this_01 = this->tables_;
  if (((proto->_has_bits_).has_bits_[0] & 2) == 0) {
    std::__cxx11::string::string
              ((string *)&dependency,anon_var_dwarf_353f69 + 0x11,(allocator *)&buf);
    psVar6 = DescriptorPool::Tables::AllocateString(this_01,(string *)&dependency);
    *(string **)(file + 8) = psVar6;
    std::__cxx11::string::~string((string *)&dependency);
  }
  else {
    psVar6 = DescriptorPool::Tables::AllocateString(this_01,(proto->package_).ptr_);
    *(string **)(file + 8) = psVar6;
  }
  *(DescriptorPool **)(file + 0x10) = this->pool_;
  bVar2 = DescriptorPool::Tables::AddFile(this->tables_,file);
  if (bVar2) {
    if ((*(string **)(file + 8))->_M_string_length != 0) {
      AddPackage(this,*(string **)(file + 8),&proto->super_Message,file);
    }
    seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
    seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar15 = (proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(file + 0x20) = iVar15;
    seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    ppFVar7 = DescriptorPool::Tables::AllocateArray<google::protobuf::FileDescriptor_const*>
                        (this->tables_,iVar15);
    *(FileDescriptor ***)(file + 0x48) = ppFVar7;
    if (this->pool_->lazily_build_dependencies_ == true) {
      poVar8 = DescriptorPool::Tables::AllocateOnceDynamic(this->tables_);
      *(once_flag **)(file + 0x18) = poVar8;
      __s = DescriptorPool::Tables::AllocateArray<std::__cxx11::string_const*>
                      (this->tables_,(proto->dependency_).super_RepeatedPtrFieldBase.current_size_);
      *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ***)(file + 0x50) = __s;
      lVar18 = (long)(proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
      if (0 < lVar18) {
        memset(__s,0,lVar18 << 3);
      }
    }
    else {
      *(undefined8 *)(file + 0x18) = 0;
      *(undefined8 *)(file + 0x50) = 0;
    }
    this_00 = &this->unused_dependency_;
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::clear(&this_00->_M_t);
    p_Var1 = &weak_deps._M_t._M_impl.super__Rb_tree_header;
    weak_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    weak_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    weak_deps._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar18 = 0;
    weak_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    weak_deps._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    for (; lVar18 < (proto->weak_dependency_).current_size_; lVar18 = lVar18 + 1) {
      dependency = (FileDescriptor *)
                   CONCAT44(dependency._4_4_,
                            *(undefined4 *)
                             ((long)(proto->weak_dependency_).arena_or_elements_ + lVar18 * 4));
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(&weak_deps._M_t,(int *)&dependency);
    }
    iVar15 = 0;
    while( true ) {
      buf._M_dataplus._M_p._0_4_ = iVar15;
      if ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= iVar15) break;
      pVar24 = std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string_const&>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)&seen_dependencies,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements[iVar15]);
      if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        AddTwiceListedError(this,proto,(int)buf._M_dataplus._M_p);
      }
      dependency = DescriptorPool::Tables::FindFile
                             (this->tables_,
                              (string *)
                              ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements
                              [(int)buf._M_dataplus._M_p]);
      if (dependency == (FileDescriptor *)0x0) {
        pDVar23 = this->pool_->underlay_;
        if (pDVar23 != (DescriptorPool *)0x0) {
          dependency = DescriptorPool::FindFileByName
                                 (pDVar23,(string *)
                                          ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->
                                          elements[(int)buf._M_dataplus._M_p]);
          goto LAB_0029551a;
        }
        if (file != (FileDescriptor *)0x0) goto LAB_0029558b;
LAB_00295907:
        file = (FileDescriptor *)0x0;
        goto LAB_00295e65;
      }
LAB_0029551a:
      if (dependency == file) goto LAB_00295907;
      if (dependency == (FileDescriptor *)0x0) {
LAB_0029558b:
        pDVar23 = this->pool_;
        if (pDVar23->lazily_build_dependencies_ == false) {
          if (pDVar23->allow_unknown_ == false) {
            if (pDVar23->enforce_weak_ == false) {
              iVar10 = std::
                       _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       ::find(&weak_deps._M_t,(key_type_conflict *)&buf);
              if ((_Rb_tree_header *)iVar10._M_node != p_Var1) {
                pDVar23 = this->pool_;
                goto LAB_002955bb;
              }
            }
            AddImportError(this,proto,(int)buf._M_dataplus._M_p);
          }
          else {
LAB_002955bb:
            dependency = DescriptorPool::NewPlaceholderFileWithMutexHeld
                                   (pDVar23,(string *)
                                            ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->
                                            elements[(int)buf._M_dataplus._M_p]);
          }
        }
      }
      else if (this->pool_->enforce_dependencies_ == true) {
        cVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&(this->pool_->unused_import_track_files_)._M_t,(proto->name_).ptr_);
        if (((_Rb_tree_header *)cVar9._M_node !=
             &(this->pool_->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header) &&
           (*(int *)(dependency + 0x24) == 0)) {
          std::
          _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
          ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                    ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                      *)this_00,&dependency);
        }
      }
      *(FileDescriptor **)(*(long *)(file + 0x48) + (long)(int)buf._M_dataplus._M_p * 8) =
           dependency;
      if ((dependency == (FileDescriptor *)0x0 & this->pool_->lazily_build_dependencies_) == 1) {
        psVar6 = DescriptorPool::Tables::AllocateString
                           (this->tables_,
                            (string *)
                            ((proto->dependency_).super_RepeatedPtrFieldBase.rep_)->elements
                            [(int)buf._M_dataplus._M_p]);
        *(string **)(*(long *)(file + 0x50) + (long)(int)buf._M_dataplus._M_p * 8) = psVar6;
      }
      iVar15 = (int)buf._M_dataplus._M_p + 1;
    }
    piVar11 = DescriptorPool::Tables::AllocateArray<int>
                        (this->tables_,(proto->public_dependency_).current_size_);
    *(int **)(file + 0x58) = piVar11;
    iVar15 = 0;
    for (lVar18 = 0; lVar18 < (proto->public_dependency_).current_size_; lVar18 = lVar18 + 1) {
      iVar4 = *(int *)((long)(proto->public_dependency_).arena_or_elements_ + lVar18 * 4);
      if ((iVar4 < 0) || ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= iVar4)) {
        AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,
                 "Invalid public dependency index.");
      }
      else {
        lVar16 = (long)iVar15;
        iVar15 = iVar15 + 1;
        *(int *)(*(long *)(file + 0x58) + lVar16 * 4) = iVar4;
        if (this->pool_->lazily_build_dependencies_ == false) {
          dependency = FileDescriptor::dependency(file,iVar4);
          std::
          _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::erase(&this_00->_M_t,&dependency);
        }
      }
    }
    *(int *)(file + 0x24) = iVar15;
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::clear(&(this->dependencies_)._M_t);
    if (this->pool_->lazily_build_dependencies_ == false) {
      for (iVar15 = 0; iVar15 < *(int *)(file + 0x20); iVar15 = iVar15 + 1) {
        pFVar12 = FileDescriptor::dependency(file,iVar15);
        RecordPublicDependencies(this,pFVar12);
      }
    }
    piVar11 = DescriptorPool::Tables::AllocateArray<int>
                        (this->tables_,(proto->weak_dependency_).current_size_);
    *(int **)(file + 0x60) = piVar11;
    iVar15 = 0;
    for (lVar18 = 0; lVar18 < (proto->weak_dependency_).current_size_; lVar18 = lVar18 + 1) {
      iVar4 = *(int *)((long)(proto->weak_dependency_).arena_or_elements_ + lVar18 * 4);
      if ((iVar4 < 0) || ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= iVar4)) {
        AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,
                 "Invalid weak dependency index.");
      }
      else {
        lVar16 = (long)iVar15;
        iVar15 = iVar15 + 1;
        *(int *)(*(long *)(file + 0x60) + lVar16 * 4) = iVar4;
      }
    }
    *(int *)(file + 0x28) = iVar15;
    iVar15 = (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(file + 0x2c) = iVar15;
    pFVar12 = file + 0x68;
    AllocateArray<google::protobuf::Descriptor>(this,iVar15,(Descriptor **)pFVar12);
    lVar18 = 0;
    for (lVar16 = 0; lVar16 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
        lVar16 = lVar16 + 1) {
      BuildMessage(this,(DescriptorProto *)
                        ((proto->message_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar16],
                   (Descriptor *)0x0,*(Descriptor **)pFVar12 + lVar18);
      lVar18 = lVar18 + 0x90;
    }
    iVar15 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(file + 0x30) = iVar15;
    AllocateArray<google::protobuf::EnumDescriptor>(this,iVar15,(EnumDescriptor **)(file + 0x70));
    lVar18 = 0;
    for (lVar16 = 0; lVar16 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        lVar16 = lVar16 + 1) {
      BuildEnum(this,(EnumDescriptorProto *)
                     ((proto->enum_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar16],
                (Descriptor *)0x0,*(EnumDescriptor **)(file + 0x70) + lVar18);
      lVar18 = lVar18 + 0x50;
    }
    iVar15 = (proto->service_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(file + 0x34) = iVar15;
    AllocateArray<google::protobuf::ServiceDescriptor>
              (this,iVar15,(ServiceDescriptor **)(file + 0x78));
    lVar18 = 0;
    pvVar19 = extraout_RDX;
    for (lVar16 = 0; lVar16 < (proto->service_).super_RepeatedPtrFieldBase.current_size_;
        lVar16 = lVar16 + 1) {
      BuildService(this,(ServiceDescriptorProto *)
                        ((proto->service_).super_RepeatedPtrFieldBase.rep_)->elements[lVar16],
                   pvVar19,*(ServiceDescriptor **)(file + 0x78) + lVar18);
      lVar18 = lVar18 + 0x30;
      pvVar19 = extraout_RDX_00;
    }
    iVar15 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(file + 0x38) = iVar15;
    AllocateArray<google::protobuf::FieldDescriptor>(this,iVar15,(FieldDescriptor **)(file + 0x80));
    lVar18 = 0;
    for (lVar16 = 0; lVar16 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
        lVar16 = lVar16 + 1) {
      BuildExtension(this,(FieldDescriptorProto *)
                          ((proto->extension_).super_RepeatedPtrFieldBase.rep_)->elements[lVar16],
                     (Descriptor *)0x0,*(FieldDescriptor **)(file + 0x80) + lVar18);
      lVar18 = lVar18 + 0x98;
    }
    if (((proto->_has_bits_).has_bits_[0] & 8) == 0) {
      *(undefined8 *)(file + 0x88) = 0;
    }
    else {
      puVar22 = (undefined1 *)proto->options_;
      if ((FileOptions *)puVar22 == (FileOptions *)0x0) {
        puVar22 = _FileOptions_default_instance_;
      }
      AllocateOptions(this,(FileOptions *)puVar22,file);
    }
    CrossLinkFile(this,file,proto);
    bVar3 = this->had_errors_;
    pFVar21 = extraout_RDX_01;
    if ((bool)bVar3 == false) {
      OptionInterpreter::OptionInterpreter((OptionInterpreter *)&dependency,this);
      paVar20 = extraout_RDX_02;
      for (pOVar17 = (this->options_to_interpret_).
                     super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          __last = (this->options_to_interpret_).
                   super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                   ._M_impl.super__Vector_impl_data._M_finish, pOVar17 != __last;
          pOVar17 = pOVar17 + 1) {
        message = pOVar17->original_options;
        this_02 = &pOVar17->options->super_MessageLite;
        local_1c8 = pOVar17;
        iVar15 = (*this_02->_vptr_MessageLite[0x15])(this_02);
        std::__cxx11::string::string((string *)&buf,"uninterpreted_option",(allocator *)&local_1f0);
        pFVar13 = Descriptor::FindFieldByName((Descriptor *)CONCAT44(extraout_var,iVar15),&buf);
        std::__cxx11::string::~string((string *)&buf);
        if (pFVar13 == (FieldDescriptor *)0x0) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&buf,LOGLEVEL_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x187d);
          pLVar14 = internal::LogMessage::operator<<
                              ((LogMessage *)&buf,
                               "CHECK failed: uninterpreted_options_field != nullptr: ");
          pLVar14 = internal::LogMessage::operator<<
                              (pLVar14,
                               "No field named \"uninterpreted_option\" in the Options proto.");
          internal::LogFinisher::operator=((LogFinisher *)&local_1f0,pLVar14);
          internal::LogMessage::~LogMessage((LogMessage *)&buf);
        }
        (*this_02->_vptr_MessageLite[0x15])(this_02);
        Reflection::ClearField(this_05,(Message *)this_02,pFVar13);
        std::vector<int,_std::allocator<int>_>::vector(&src_path,&pOVar17->element_path);
        buf._M_dataplus._M_p._0_4_ = *(undefined4 *)(pFVar13 + 0x44);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&src_path,(int *)&buf);
        iVar15 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
        std::__cxx11::string::string((string *)&buf,"uninterpreted_option",(allocator *)&local_1f0);
        pFVar13 = Descriptor::FindFieldByName((Descriptor *)CONCAT44(extraout_var_00,iVar15),&buf);
        std::__cxx11::string::~string((string *)&buf);
        if (pFVar13 == (FieldDescriptor *)0x0) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&buf,LOGLEVEL_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x1888);
          pLVar14 = internal::LogMessage::operator<<
                              ((LogMessage *)&buf,
                               "CHECK failed: original_uninterpreted_options_field != nullptr: ");
          pLVar14 = internal::LogMessage::operator<<
                              (pLVar14,
                               "No field named \"uninterpreted_option\" in the Options proto.");
          internal::LogFinisher::operator=((LogFinisher *)&local_1f0,pLVar14);
          internal::LogMessage::~LogMessage((LogMessage *)&buf);
        }
        (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
        iVar15 = Reflection::FieldSize(this_06,message,pFVar13);
        iVar4 = 0;
        while (buf._M_dataplus._M_p._0_4_ = iVar4, iVar4 < iVar15) {
          std::vector<int,_std::allocator<int>_>::push_back(&src_path,(value_type_conflict2 *)&buf);
          (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
          aaStack_1c0[0]._0_8_ =
               Reflection::GetRepeatedMessage(this_07,message,pFVar13,(int)buf._M_dataplus._M_p);
          bVar2 = OptionInterpreter::InterpretSingleOption
                            ((OptionInterpreter *)&dependency,(Message *)this_02,&src_path,
                             &pOVar17->element_path);
          if (!bVar2) {
            local_1c8 = (OptionsToInterpret *)0x0;
            aaStack_1c0[0]._M_allocated_capacity = (Message *)0x0;
            goto LAB_00295d7a;
          }
          src_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = src_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + -1;
          iVar4 = (int)buf._M_dataplus._M_p + 1;
        }
        local_1c8 = (OptionsToInterpret *)0x0;
        aaStack_1c0[0]._M_allocated_capacity = (Message *)0x0;
        iVar15 = (*this_02->_vptr_MessageLite[3])(this_02);
        this_04 = (MessageLite *)CONCAT44(extraout_var_01,iVar15);
        (*this_02->_vptr_MessageLite[0x15])(this_02);
        Reflection::Swap(this_08,(Message *)this_04,(Message *)this_02);
        buf._M_dataplus._M_p = (pointer)&buf.field_2;
        buf._M_string_length = 0;
        buf.field_2._M_local_buf[0] = '\0';
        bVar2 = MessageLite::AppendToString(this_04,&buf);
        if (bVar2) {
          bVar2 = MessageLite::ParseFromString(this_02,&buf);
          if (!bVar2) goto LAB_00295c65;
        }
        else {
LAB_00295c65:
          pFVar21 = dependency;
          Message::ShortDebugString_abi_cxx11_(&local_a0,(Message *)this_04);
          std::operator+(&local_80,
                         "Some options could not be correctly parsed using the proto descriptors compiled into this binary.\nUnparsed options: "
                         ,&local_a0);
          std::operator+(&local_110,&local_80,"\nParsing attempt:  ");
          Message::ShortDebugString_abi_cxx11_(&local_c0,(Message *)this_02);
          std::operator+(&local_1f0,&local_110,&local_c0);
          AddError((DescriptorBuilder *)pFVar21,&pOVar17->element_name,message,OTHER,&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&local_a0);
          (*this_02->_vptr_MessageLite[0x15])(this_02);
          Reflection::Swap(this_09,(Message *)this_04,(Message *)this_02);
        }
        std::__cxx11::string::~string((string *)&buf);
        (*this_04->_vptr_MessageLite[1])(this_04);
LAB_00295d7a:
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&src_path.super__Vector_base<int,_std::allocator<int>_>);
        paVar20 = extraout_RDX_03;
      }
      __first = (this->options_to_interpret_).
                super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pOVar17 != __first) {
        std::
        _Destroy<google::protobuf::(anonymous_namespace)::OptionsToInterpret*,google::protobuf::(anonymous_namespace)::OptionsToInterpret>
                  (__first,__last,paVar20);
        (this->options_to_interpret_).
        super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
        ._M_impl.super__Vector_impl_data._M_finish = __first;
      }
      if (local_218 != (SourceCodeInfo *)0x0) {
        OptionInterpreter::UpdateSourceCodeInfo((OptionInterpreter *)&dependency,local_218);
      }
      OptionInterpreter::~OptionInterpreter((OptionInterpreter *)&dependency);
      bVar3 = this->had_errors_;
      pFVar21 = extraout_RDX_04;
    }
    if (((bVar3 & 1) == 0) && (this->pool_->lazily_build_dependencies_ == false)) {
      ValidateFileOptions(this,file,proto);
      bVar3 = this->had_errors_;
      pFVar21 = extraout_RDX_05;
    }
    if ((bVar3 & 1) != 0) {
      lVar18 = 0;
      for (lVar16 = 0; lVar16 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
          lVar16 = lVar16 + 1) {
        DetectMapConflicts(this,*(Descriptor **)pFVar12 + lVar18,
                           (DescriptorProto *)
                           ((proto->message_type_).super_RepeatedPtrFieldBase.rep_)->elements
                           [lVar16]);
        lVar18 = lVar18 + 0x90;
        pFVar21 = extraout_RDX_06;
      }
    }
    if (((this->unused_dependency_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
       (this->pool_->lazily_build_dependencies_ == false)) {
      LogUnusedDependency(this,proto,pFVar21);
    }
    if (this->had_errors_ != false) {
      file = (FileDescriptor *)0x0;
    }
LAB_00295e65:
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&weak_deps._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&seen_dependencies._M_t);
  }
  else {
    AddError(this,(proto->name_).ptr_,&proto->super_Message,OTHER,
             "A file with this name is already in the pool.");
    file = (FileDescriptor *)0x0;
  }
  return file;
}

Assistant:

FileDescriptor* DescriptorBuilder::BuildFileImpl(
    const FileDescriptorProto& proto) {
  FileDescriptor* result = tables_->Allocate<FileDescriptor>();
  file_ = result;

  result->is_placeholder_ = false;
  result->finished_building_ = false;
  SourceCodeInfo* info = nullptr;
  if (proto.has_source_code_info()) {
    info = tables_->AllocateMessage<SourceCodeInfo>();
    info->CopyFrom(proto.source_code_info());
    result->source_code_info_ = info;
  } else {
    result->source_code_info_ = &SourceCodeInfo::default_instance();
  }

  file_tables_ = tables_->AllocateFileTables();
  file_->tables_ = file_tables_;

  if (!proto.has_name()) {
    AddError("", proto, DescriptorPool::ErrorCollector::OTHER,
             "Missing field: FileDescriptorProto.name.");
  }

  // TODO(liujisi): Report error when the syntax is empty after all the protos
  // have added the syntax statement.
  if (proto.syntax().empty() || proto.syntax() == "proto2") {
    file_->syntax_ = FileDescriptor::SYNTAX_PROTO2;
  } else if (proto.syntax() == "proto3") {
    file_->syntax_ = FileDescriptor::SYNTAX_PROTO3;
  } else {
    file_->syntax_ = FileDescriptor::SYNTAX_UNKNOWN;
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "Unrecognized syntax: " + proto.syntax());
  }

  result->name_ = tables_->AllocateString(proto.name());
  if (proto.has_package()) {
    result->package_ = tables_->AllocateString(proto.package());
  } else {
    // We cannot rely on proto.package() returning a valid string if
    // proto.has_package() is false, because we might be running at static
    // initialization time, in which case default values have not yet been
    // initialized.
    result->package_ = tables_->AllocateString("");
  }
  result->pool_ = pool_;

  // Add to tables.
  if (!tables_->AddFile(result)) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "A file with this name is already in the pool.");
    // Bail out early so that if this is actually the exact same file, we
    // don't end up reporting that every single symbol is already defined.
    return nullptr;
  }
  if (!result->package().empty()) {
    AddPackage(result->package(), proto, result);
  }

  // Make sure all dependencies are loaded.
  std::set<std::string> seen_dependencies;
  result->dependency_count_ = proto.dependency_size();
  result->dependencies_ =
      tables_->AllocateArray<const FileDescriptor*>(proto.dependency_size());
  if (pool_->lazily_build_dependencies_) {
    result->dependencies_once_ = tables_->AllocateOnceDynamic();
    result->dependencies_names_ =
        tables_->AllocateArray<const std::string*>(proto.dependency_size());
    if (proto.dependency_size() > 0) {
      memset(result->dependencies_names_, 0,
             sizeof(*result->dependencies_names_) * proto.dependency_size());
    }
  } else {
    result->dependencies_once_ = nullptr;
    result->dependencies_names_ = nullptr;
  }
  unused_dependency_.clear();
  std::set<int> weak_deps;
  for (int i = 0; i < proto.weak_dependency_size(); ++i) {
    weak_deps.insert(proto.weak_dependency(i));
  }
  for (int i = 0; i < proto.dependency_size(); i++) {
    if (!seen_dependencies.insert(proto.dependency(i)).second) {
      AddTwiceListedError(proto, i);
    }

    const FileDescriptor* dependency = tables_->FindFile(proto.dependency(i));
    if (dependency == nullptr && pool_->underlay_ != nullptr) {
      dependency = pool_->underlay_->FindFileByName(proto.dependency(i));
    }

    if (dependency == result) {
      // Recursive import.  dependency/result is not fully initialized, and it's
      // dangerous to try to do anything with it.  The recursive import error
      // will be detected and reported in DescriptorBuilder::BuildFile().
      return nullptr;
    }

    if (dependency == nullptr) {
      if (!pool_->lazily_build_dependencies_) {
        if (pool_->allow_unknown_ ||
            (!pool_->enforce_weak_ && weak_deps.find(i) != weak_deps.end())) {
          dependency =
              pool_->NewPlaceholderFileWithMutexHeld(proto.dependency(i));
        } else {
          AddImportError(proto, i);
        }
      }
    } else {
      // Add to unused_dependency_ to track unused imported files.
      // Note: do not track unused imported files for public import.
      if (pool_->enforce_dependencies_ &&
          (pool_->unused_import_track_files_.find(proto.name()) !=
           pool_->unused_import_track_files_.end()) &&
          (dependency->public_dependency_count() == 0)) {
        unused_dependency_.insert(dependency);
      }
    }

    result->dependencies_[i] = dependency;
    if (pool_->lazily_build_dependencies_ && !dependency) {
      result->dependencies_names_[i] =
          tables_->AllocateString(proto.dependency(i));
    }
  }

  // Check public dependencies.
  int public_dependency_count = 0;
  result->public_dependencies_ =
      tables_->AllocateArray<int>(proto.public_dependency_size());
  for (int i = 0; i < proto.public_dependency_size(); i++) {
    // Only put valid public dependency indexes.
    int index = proto.public_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->public_dependencies_[public_dependency_count++] = index;
      // Do not track unused imported files for public import.
      // Calling dependency(i) builds that file when doing lazy imports,
      // need to avoid doing this. Unused dependency detection isn't done
      // when building lazily, anyways.
      if (!pool_->lazily_build_dependencies_) {
        unused_dependency_.erase(result->dependency(index));
      }
    } else {
      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               "Invalid public dependency index.");
    }
  }
  result->public_dependency_count_ = public_dependency_count;

  // Build dependency set
  dependencies_.clear();
  // We don't/can't do proper dependency error checking when
  // lazily_build_dependencies_, and calling dependency(i) will force
  // a dependency to be built, which we don't want.
  if (!pool_->lazily_build_dependencies_) {
    for (int i = 0; i < result->dependency_count(); i++) {
      RecordPublicDependencies(result->dependency(i));
    }
  }

  // Check weak dependencies.
  int weak_dependency_count = 0;
  result->weak_dependencies_ =
      tables_->AllocateArray<int>(proto.weak_dependency_size());
  for (int i = 0; i < proto.weak_dependency_size(); i++) {
    int index = proto.weak_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->weak_dependencies_[weak_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               "Invalid weak dependency index.");
    }
  }
  result->weak_dependency_count_ = weak_dependency_count;

  // Convert children.
  BUILD_ARRAY(proto, result, message_type, BuildMessage, nullptr);
  BUILD_ARRAY(proto, result, enum_type, BuildEnum, nullptr);
  BUILD_ARRAY(proto, result, service, BuildService, nullptr);
  BUILD_ARRAY(proto, result, extension, BuildExtension, nullptr);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = nullptr;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  // Note that the following steps must occur in exactly the specified order.

  // Cross-link.
  CrossLinkFile(result, proto);

  // Interpret any remaining uninterpreted options gathered into
  // options_to_interpret_ during descriptor building.  Cross-linking has made
  // extension options known, so all interpretations should now succeed.
  if (!had_errors_) {
    OptionInterpreter option_interpreter(this);
    for (std::vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretOptions(&(*iter));
    }
    options_to_interpret_.clear();
    if (info != nullptr) {
      option_interpreter.UpdateSourceCodeInfo(info);
    }
  }

  // Validate options. See comments at InternalSetLazilyBuildDependencies about
  // error checking and lazy import building.
  if (!had_errors_ && !pool_->lazily_build_dependencies_) {
    ValidateFileOptions(result, proto);
  }

  // Additional naming conflict check for map entry types. Only need to check
  // this if there are already errors.
  if (had_errors_) {
    for (int i = 0; i < proto.message_type_size(); ++i) {
      DetectMapConflicts(result->message_type(i), proto.message_type(i));
    }
  }


  // Again, see comments at InternalSetLazilyBuildDependencies about error
  // checking.
  if (!unused_dependency_.empty() && !pool_->lazily_build_dependencies_) {
    LogUnusedDependency(proto, result);
  }

  if (had_errors_) {
    return nullptr;
  } else {
    return result;
  }
}